

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall Script_GetData_Test::~Script_GetData_Test(Script_GetData_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, GetData) {
  Script script(
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
  ByteData byte_data = script.GetData();
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
}